

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fProgramInterfaceQueryTests.cpp
# Opt level: O2

void deqp::gles31::Functional::anon_unknown_0::
     generateBufferVariableTopLevelCases<(deqp::gles31::Functional::ProgramResourcePropFlags)32768>
               (Context *context,SharedPtr *parentStructure,TestCaseGroup *targetGroup)

{
  ArrayElement *this;
  allocator<char> local_51;
  SharedPtr unsized;
  string local_40;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_40,SSBOArrayLengthTests::init::arraysSized + 1,
             (allocator<char> *)&unsized);
  generateBufferBackedVariableAggregateTypeCases
            (context,parentStructure,targetGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE,TYPE_FLOAT_VEC4,&local_40,3);
  std::__cxx11::string::~string((string *)&local_40);
  this = (ArrayElement *)operator_new(0x28);
  ResourceDefinition::ArrayElement::ArrayElement(this,parentStructure,-2);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  SharedPtr(&unsized,(Node *)this);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"_unsized_array",&local_51)
  ;
  generateBufferBackedVariableAggregateTypeCases
            (context,&unsized,targetGroup,PROGRAMINTERFACE_BUFFER_VARIABLE,
             PROGRAMRESOURCEPROP_TOP_LEVEL_ARRAY_SIZE,TYPE_FLOAT_VEC4,&local_40,2);
  std::__cxx11::string::~string((string *)&local_40);
  de::SharedPtr<const_deqp::gles31::Functional::(anonymous_namespace)::ResourceDefinition::Node>::
  ~SharedPtr(&unsized);
  return;
}

Assistant:

static void generateBufferVariableTopLevelCases (Context& context, const ResourceDefinition::Node::SharedPtr& parentStructure, tcu::TestCaseGroup* targetGroup)
{
	// basic and aggregate types
	generateBufferBackedVariableAggregateTypeCases(context, parentStructure, targetGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, TargetProp, glu::TYPE_FLOAT_VEC4, "", 3);

	// basic and aggregate types in an unsized array
	{
		const ResourceDefinition::Node::SharedPtr unsized(new ResourceDefinition::ArrayElement(parentStructure, ResourceDefinition::ArrayElement::UNSIZED_ARRAY));

		generateBufferBackedVariableAggregateTypeCases(context, unsized, targetGroup, PROGRAMINTERFACE_BUFFER_VARIABLE, TargetProp, glu::TYPE_FLOAT_VEC4, "_unsized_array", 2);
	}
}